

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O0

bool OpenFileForReading<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename,
               FFHANDLE *handle)

{
  char *__filename;
  FILE *pFVar1;
  undefined8 uVar2;
  string local_78;
  string local_48;
  FILE *local_28;
  FILE *f;
  FFHANDLE *handle_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename_local;
  
  f = (FILE *)handle;
  handle_local = (FFHANDLE *)filename;
  ToString<char>(&local_48,filename);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"r");
  std::__cxx11::string::~string((string *)&local_48);
  if (pFVar1 != (FILE *)0x0) {
    *(FILE **)f = pFVar1;
  }
  else {
    local_28 = pFVar1;
    ToString<char>(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handle_local
                  );
    uVar2 = std::__cxx11::string::c_str();
    error("fopen(%s)",uVar2);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool OpenFileForReading(const std::basic_string<T>& filename, FFHANDLE& handle)
{
#ifdef _WIN32
    FFHANDLE h= CreateFile(ToTString(filename).c_str(), GENERIC_READ, FILE_SHARE_READ,
                NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (h==INVALID_HANDLE_VALUE || h==NULL)
    {
        logerror("CreateFile(%ls, READ)", filename.c_str());
        return false;
    }
    handle= h;

#endif
#ifdef _UNIX
    FILE *f= fopen(ToString(filename).c_str(), "r");
    if (f==NULL) {
        logerror("fopen(%s)", ToString(filename).c_str());
        return false;
    }
    handle= f;
#endif
    return true;
}